

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void deqp::gls::BuiltinPrecisionTests::
     ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doPrintIVal
               (FloatFormat *fmt,IVal *ival,ostream *os)

{
  Interval *ival_00;
  int local_24;
  int ndx;
  ostream *os_local;
  IVal *ival_local;
  FloatFormat *fmt_local;
  
  std::operator<<(os,"(");
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    if (0 < local_24) {
      std::operator<<(os,", ");
    }
    ival_00 = tcu::Vector<tcu::Interval,_4>::operator[](ival,local_24);
    printIVal<float>(fmt,ival_00,os);
  }
  std::operator<<(os,")");
  return;
}

Assistant:

static void			doPrintIVal		(const FloatFormat& fmt, const IVal ival, ostream& os)
	{
		os << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printIVal<Element>(fmt, ival[ndx], os);
		}

		os << ")";
	}